

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * fmt::v5::internal::
       format_decimal<unsigned_int,char,fmt::v5::internal::add_thousands_sep<char>>
                 (char *buffer,uint value,int num_digits,add_thousands_sep<char> thousands_sep)

{
  char *message;
  int in_EDX;
  uint uVar1;
  uint in_ESI;
  long in_RDI;
  uint index;
  uint index_1;
  char *end;
  assertion_failure *this;
  char **in_stack_ffffffffffffffd8;
  add_thousands_sep<char> *in_stack_ffffffffffffffe0;
  uint local_14;
  char *local_10;
  
  this = (assertion_failure *)&stack0x00000008;
  if (in_EDX < 0) {
    message = (char *)__cxa_allocate_exception(0x10);
    assertion_failure::assertion_failure(this,message);
    __cxa_throw(message,&assertion_failure::typeinfo,assertion_failure::~assertion_failure);
  }
  local_14 = in_ESI;
  local_10 = (char *)(in_RDI + in_EDX);
  while (99 < local_14) {
    uVar1 = (local_14 % 100) * 2;
    local_14 = local_14 / 100;
    local_10[-1] = basic_data<void>::DIGITS[uVar1 + 1];
    add_thousands_sep<char>::operator()(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    local_10[-2] = basic_data<void>::DIGITS[uVar1];
    add_thousands_sep<char>::operator()(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    local_10 = local_10 + -2;
  }
  if (local_14 < 10) {
    local_10[-1] = (char)local_14 + '0';
  }
  else {
    local_10[-1] = basic_data<void>::DIGITS[local_14 * 2 + 1];
    add_thousands_sep<char>::operator()(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    local_10[-2] = basic_data<void>::DIGITS[local_14 * 2];
  }
  return (char *)(in_RDI + in_EDX);
}

Assistant:

inline Char *format_decimal(Char *buffer, UInt value, int num_digits,
                            ThousandsSep thousands_sep) {
  FMT_ASSERT(num_digits >= 0, "invalid digit count");
  buffer += num_digits;
  Char *end = buffer;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    unsigned index = static_cast<unsigned>((value % 100) * 2);
    value /= 100;
    *--buffer = static_cast<Char>(data::DIGITS[index + 1]);
    thousands_sep(buffer);
    *--buffer = static_cast<Char>(data::DIGITS[index]);
    thousands_sep(buffer);
  }
  if (value < 10) {
    *--buffer = static_cast<Char>('0' + value);
    return end;
  }
  unsigned index = static_cast<unsigned>(value * 2);
  *--buffer = static_cast<Char>(data::DIGITS[index + 1]);
  thousands_sep(buffer);
  *--buffer = static_cast<Char>(data::DIGITS[index]);
  return end;
}